

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

CallbackResult __thiscall EntryBTree::traverseCallback(EntryBTree *this,uint8_t *data)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  ostream *poVar3;
  void *this_00;
  uint8_t *in_RDI;
  KeyType obj;
  CallbackResult result;
  KeyType *in_stack_ffffffffffffffd8;
  EntryBTree *in_stack_ffffffffffffffe0;
  
  EntryKey::EntryKey((EntryKey *)&stack0xffffffffffffffdc);
  puVar2 = parseData(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  if (puVar2 == (uint8_t *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot parse Entry object.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    uVar1 = EntryKey::nameIndex((EntryKey *)&stack0xffffffffffffffdc);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,uVar1);
    poVar3 = std::operator<<(poVar3,":");
    uVar1 = EntryKey::extIndex((EntryKey *)&stack0xffffffffffffffdc);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
    poVar3 = std::operator<<(poVar3,":");
    uVar1 = EntryKey::linkIndex((EntryKey *)&stack0xffffffffffffffdc);
    this_00 = (void *)std::ostream::operator<<(poVar3,uVar1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return CONTINUE;
}

Assistant:

EntryBTree::CallbackResult EntryBTree::traverseCallback(const uint8_t* data) const
{
	CallbackResult result = CallbackResult::CONTINUE;

	KeyType obj;
	if (parseData(obj, data)) {
		std::cout << obj.nameIndex() << ":" << obj.extIndex() << ":" << obj.linkIndex() << std::endl;
	} else {
		std::cerr << "Cannot parse Entry object." << std::endl;
	}

	return result;
}